

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::CombinePubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *pubkey_list)

{
  pointer pBVar1;
  uchar *puVar2;
  undefined8 input;
  int iVar3;
  ulong uVar4;
  CfdException *pCVar5;
  long lVar6;
  long lVar7;
  allocator local_f1;
  undefined1 local_f0 [32];
  secp256k1_context *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  secp256k1_pubkey combine_key;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> key_array;
  size_t byte_size;
  vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_> ptr_array;
  
  local_d0 = (secp256k1_context *)this->secp256k1_context_;
  if (local_d0 == (secp256k1_context *)0x0) {
    combine_key.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    combine_key.data[8] = '8';
    combine_key.data[9] = '\0';
    combine_key.data[10] = '\0';
    combine_key.data[0xb] = '\0';
    combine_key.data._16_8_ = anon_var_dwarf_5e7847;
    logger::warn<>((CfdSourceLocation *)&combine_key,"Secp256k1 context is NULL.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&combine_key,"Secp256k1 context is NULL.",(allocator *)local_f0);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&combine_key);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar4 = ((long)(pubkey_list->
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pubkey_list->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar4 < 2) {
    combine_key.data._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 99;
    combine_key.data[8] = '>';
    combine_key.data[9] = '\0';
    combine_key.data[10] = '\0';
    combine_key.data[0xb] = '\0';
    combine_key.data._16_8_ = anon_var_dwarf_5e7847;
    logger::warn<>((CfdSourceLocation *)&combine_key,"Invalid Argument pubkey list.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&combine_key,"Invalid Pubkey List data.",(allocator *)local_f0);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&combine_key);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&key_array,uVar4,(allocator_type *)&combine_key);
  ::std::vector<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::vector
            (&ptr_array,
             ((long)(pubkey_list->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pubkey_list->
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&combine_key);
  lVar7 = 0;
  lVar6 = 0;
  uVar4 = 0;
  while( true ) {
    pBVar1 = (pubkey_list->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pubkey_list->
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x18) <= uVar4)
    break;
    puVar2 = (key_array.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
              _M_impl.super__Vector_impl_data._M_start)->data;
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&combine_key,
                       (ByteData *)
                       ((long)&(pBVar1->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + lVar7));
    input = combine_key.data._0_8_;
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0,
                       (ByteData *)
                       ((long)&(((pubkey_list->
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + lVar7));
    iVar3 = secp256k1_ec_pubkey_parse
                      (local_d0,(secp256k1_pubkey *)(puVar2 + lVar6),(uchar *)input,
                       CONCAT44(local_f0._12_4_,local_f0._8_4_) - local_f0._0_8_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&combine_key);
    if (iVar3 != 1) {
      combine_key.data._0_8_ =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
           + 99;
      combine_key.data[8] = 'N';
      combine_key.data[9] = '\0';
      combine_key.data[10] = '\0';
      combine_key.data[0xb] = '\0';
      combine_key.data._16_8_ = anon_var_dwarf_5e7847;
      logger::warn<>((CfdSourceLocation *)&combine_key,"Secp256k1 pubkey parse Error.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&combine_key,"Secp256k1 pubkey parse Error.",(allocator *)local_f0);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&combine_key);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ptr_array.super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] =
         (anon_struct_64_1_898a9ca8 *)
         ((key_array.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl
           .super__Vector_impl_data._M_start)->data + lVar6);
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x40;
    lVar7 = lVar7 + 0x18;
  }
  iVar3 = secp256k1_ec_pubkey_combine
                    (local_d0,&combine_key,
                     (secp256k1_pubkey **)
                     ptr_array.
                     super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)key_array.
                           super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)key_array.
                           super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 6);
  if (iVar3 != 1) {
    local_f0._0_8_ = "cfdcore_secp256k1.cpp";
    local_f0._8_4_ = 0x5a;
    local_f0._16_8_ = "CombinePubkeySecp256k1Ec";
    logger::warn<>((CfdSourceLocation *)local_f0,"Secp256k1 pubkey combine Error.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_f0,"Secp256k1 pubkey combine Error.",(allocator *)&byte_data);
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&byte_data,0x41,(allocator_type *)local_f0);
  byte_size = (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  iVar3 = secp256k1_ec_pubkey_serialize
                    (local_d0,byte_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,&byte_size,&combine_key,0x102
                    );
  if (iVar3 == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&byte_data,byte_size);
    ByteData::ByteData(__return_storage_ptr__,&byte_data);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>::~_Vector_base
              (&ptr_array.
                super__Vector_base<secp256k1_pubkey_*,_std::allocator<secp256k1_pubkey_*>_>);
    ::std::_Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~_Vector_base
              (&key_array.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>);
    return __return_storage_ptr__;
  }
  local_f0._0_8_ = "cfdcore_secp256k1.cpp";
  local_f0._8_4_ = 0x67;
  local_f0._16_8_ = "CombinePubkeySecp256k1Ec";
  logger::warn<>((CfdSourceLocation *)local_f0,"Secp256k1 pubkey serialize Error.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_f0,"Secp256k1 pubkey serialize Error.",&local_f1);
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_f0);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::CombinePubkeySecp256k1Ec(
    const std::vector<ByteData>& pubkey_list) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (pubkey_list.size() < 2) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey list.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey List data.");
  }

  std::vector<secp256k1_pubkey> key_array(pubkey_list.size());
  std::vector<secp256k1_pubkey*> ptr_array(pubkey_list.size());
  int ret;

  for (size_t i = 0; i < pubkey_list.size(); ++i) {
    // Change ByteData to secp256k1_pubkey format
    ret = secp256k1_ec_pubkey_parse(
        context, &key_array[i], pubkey_list[i].GetBytes().data(),
        pubkey_list[i].GetBytes().size());

    if (ret != 1) {
      warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
    }
    ptr_array[i] = &key_array[i];
  }

  // Join Pubkey
  secp256k1_pubkey combine_key;
  ret = secp256k1_ec_pubkey_combine(
      context, &combine_key, ptr_array.data(), key_array.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey combine Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey combine Error.");
  }

  std::vector<uint8_t> byte_data(65);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &combine_key,
      SECP256K1_EC_COMPRESSED);

  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}